

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O2

int CECoordinates::Observed2Galactic
              (double az,double zen,double *glon,double *glat,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  int iVar1;
  CEAngleType local_1c;
  
  iVar1 = Observed2ICRS(az,zen,glon,glat,julian_date,longitude,latitude,elevation_m,pressure_hPa,
                        temperature_celsius,relative_humidity,dut1,xp,yp,wavelength_um);
  if (iVar1 == 0) {
    local_1c = RADIANS;
    ICRS2Galactic(*glon,*glat,glon,glat,&local_1c);
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2Galactic(double az, double zen,
                                 double *glon, double *glat,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um)
{
    // Convert from Observed -> ICRS
    int err_code = Observed2ICRS(az, zen,
                                 glon, glat,
                                 julian_date,
                                 longitude, latitude,
                                 elevation_m, pressure_hPa,
                                 temperature_celsius, relative_humidity,
                                 dut1, xp, yp, wavelength_um) ;
    if (err_code == 0) {
        // Convert from ICRS -> Galactic
        ICRS2Galactic(*glon, *glat, glon, glat,
                      CEAngleType::RADIANS) ;
    }
    
    return err_code ;
}